

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendRequest_Diagnostics
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 SubFunction,U16 Data)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  uint local_58;
  
  if (this->mSettings->mModbusMode < ModbusASCIIClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,8);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(SubFunction & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(SubFunction >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Data & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Data >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    local_58 = (uint)(SubFunction >> 8);
    uVar1 = this->crc_tab16
            [(ushort)(this->crc_tab16
                      [(ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf7] >> 8
                               ^ this->crc_tab16
                                 [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ SubFunction ^
                                          this->crc_tab16
                                          [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf7]) & 0xff])
                       & 0xff ^ local_58] >> 8 ^
                     this->crc_tab16
                     [(ushort)(this->crc_tab16
                               [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ SubFunction ^
                                        this->crc_tab16
                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf7]) & 0xff] >>
                               8 ^ Data ^
                              this->crc_tab16
                              [(ushort)(this->crc_tab16
                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf7] >> 8 ^
                                       this->crc_tab16
                                       [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ SubFunction
                                                ^ this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf7])
                                        & 0xff]) & 0xff ^ local_58]) & 0xff]) & 0xff ^
             (uint)(Data >> 8)];
    CreateModbusByte(this,(ulong)((ushort)(this->crc_tab16
                                           [(ushort)(this->crc_tab16
                                                     [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8
                                                               ^ SubFunction ^
                                                              this->crc_tab16
                                                              [this->crc_tab16[(byte)~DeviceID] &
                                                               0xff ^ 0xf7]) & 0xff] >> 8 ^ Data ^
                                                    this->crc_tab16
                                                    [(ushort)(this->crc_tab16
                                                              [this->crc_tab16[(byte)~DeviceID] &
                                                               0xff ^ 0xf7] >> 8 ^
                                                             this->crc_tab16
                                                             [(ushort)(this->crc_tab16
                                                                       [(byte)~DeviceID] >> 8 ^
                                                                       SubFunction ^
                                                                      this->crc_tab16
                                                                      [this->crc_tab16
                                                                       [(byte)~DeviceID] & 0xff ^
                                                                       0xf7]) & 0xff]) & 0xff ^
                                                     local_58]) & 0xff] >> 8 ^ uVar1) & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar1 >> 8);
  }
  else {
    bVar4 = (byte)(SubFunction >> 8);
    bVar2 = (byte)(Data >> 8);
    local_58._0_1_ = (char)SubFunction + DeviceID + bVar4 + (byte)Data + bVar2;
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar3 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar3 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x30);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x38);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,bVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(U8)((SubFunction & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(byte)(SubFunction >> 4) & 0xf);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(U8)(SubFunction & 0xf0f));
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,bVar2 >> 4);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(U8)((Data & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(byte)Data >> 4);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(U8)(Data & 0xf0f));
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(pMVar6,(byte)(-(char)local_58 - 8U) >> 4);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = BinToLATIN1(this_00,-(char)local_58 - 8U & 0xf);
    CreateModbusByte(this,(ulong)bVar4);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendRequest_Diagnostics( U8 DeviceID, U16 SubFunction, U16 Data )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x08 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( SubFunction & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( SubFunction & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Data & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Data & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x08 );
        CRCValue = update_CRC( CRCValue, SubFunction & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( SubFunction & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Data & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Data & 0xFF00 ) >> 8 );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x08;
        LRCvalue = LRCvalue + ( SubFunction & 0x00FF );
        LRCvalue = LRCvalue + ( ( SubFunction & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Data & 0x00FF );
        LRCvalue = LRCvalue + ( ( Data & 0xFF00 ) >> 8 );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '0' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '8' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( SubFunction & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( SubFunction & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( SubFunction & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( SubFunction & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Data & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Data & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Data & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Data & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}